

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlInitializeCatalog(void)

{
  xmlCatalogPtr pxVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  xmlCatalogPtr pxVar5;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar6;
  byte *pbVar7;
  long lVar8;
  xmlCatalogEntryPtr local_38;
  
  if (xmlCatalogInitialized != '\0') {
    return;
  }
  xmlInitializeCatalogData();
  xmlRMutexLock(xmlCatalogMutex);
  pcVar3 = getenv("XML_DEBUG_CATALOG");
  if (pcVar3 != (char *)0x0) {
    xmlDebugCatalogs = 1;
  }
  pxVar1 = xmlDefaultCatalog;
  if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
    pbVar4 = (byte *)getenv("XML_CATALOG_FILES");
    pxVar5 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    pxVar1 = xmlDefaultCatalog;
    if (pxVar5 != (xmlCatalogPtr)0x0) {
      pbVar7 = (byte *)"file:///etc/xml/catalog";
      if (pbVar4 != (byte *)0x0) {
        pbVar7 = pbVar4;
      }
      local_38 = (xmlCatalogEntryPtr)&pxVar5->xml;
LAB_0013ba00:
      bVar2 = *pbVar7;
      pbVar4 = pbVar7;
      pxVar1 = pxVar5;
      if (bVar2 != 0) {
        while (bVar2 < 0x21) {
          if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
            pbVar7 = pbVar4;
            if ((ulong)bVar2 == 0) goto LAB_0013ba00;
            break;
          }
          bVar2 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        }
        lVar8 = 0;
        while ((0x20 < bVar2 || ((0x100002601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
          bVar2 = pbVar4[lVar8 + 1];
          lVar8 = lVar8 + 1;
        }
        URL = xmlStrndup(pbVar4,(int)lVar8);
        pbVar7 = pbVar4 + lVar8;
        if (URL != (xmlChar *)0x0) {
          pxVar6 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                      xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
          local_38->next = pxVar6;
          if (pxVar6 != (xmlCatalogEntryPtr)0x0) {
            local_38 = pxVar6;
          }
          (*xmlFree)(URL);
          pbVar7 = pbVar4 + lVar8;
        }
        goto LAB_0013ba00;
      }
    }
  }
  xmlDefaultCatalog = pxVar1;
  xmlRMutexUnlock(xmlCatalogMutex);
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitializeCatalogData();
    xmlRMutexLock(xmlCatalogMutex);

    if (getenv("XML_DEBUG_CATALOG"))
	xmlDebugCatalogs = 1;

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
#if defined(_WIN32) && defined(_MSC_VER)
    {
		void* hmodule;
		hmodule = GetModuleHandleA("libxml2.dll");
		if (hmodule == NULL)
			hmodule = GetModuleHandleA(NULL);
		if (hmodule != NULL) {
			char buf[256];
			unsigned long len = GetModuleFileNameA(hmodule, buf, 255);
			if (len != 0) {
				char* p = &(buf[len]);
				while (*p != '\\' && p > buf)
					p--;
				if (p != buf) {
					xmlChar* uri;
					strncpy(p, "\\..\\etc\\catalog", 255 - (p - buf));
					uri = xmlCanonicPath((const xmlChar*)buf);
					if (uri != NULL) {
						strncpy(XML_XML_DEFAULT_CATALOG, uri, 255);
						xmlFree(uri);
					}
				}
			}
		}
		catalogs = XML_XML_DEFAULT_CATALOG;
    }
#else
	    catalogs = XML_XML_DEFAULT_CATALOG;
#endif

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(xmlCatalogMutex);
}